

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linde_buzo_gray_algorithm.cc
# Opt level: O0

void __thiscall
sptk::LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
          (LindeBuzoGrayAlgorithm *this,int num_order,int initial_codebook_size,
          int target_codebook_size,int min_num_vector_in_cluster,int num_iteration,
          double convergence_threshold,double splitting_factor,int seed)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_stack_00000008;
  VectorQuantization *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__LindeBuzoGrayAlgorithm_00147c68;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x14) = in_R8D;
  *(undefined4 *)(in_RDI + 3) = in_R9D;
  in_RDI[4] = in_XMM0_Qa;
  in_RDI[5] = in_XMM1_Qa;
  *(undefined4 *)(in_RDI + 6) = in_stack_00000008;
  DistanceCalculation::DistanceCalculation
            ((DistanceCalculation *)(in_RDI + 7),*(int *)(in_RDI + 1),kSquaredEuclidean);
  StatisticsAccumulation::StatisticsAccumulation
            ((StatisticsAccumulation *)(in_RDI + 10),*(int *)(in_RDI + 1),1,false,false);
  VectorQuantization::VectorQuantization
            (in_stack_ffffffffffffffc0,(int)((ulong)(in_RDI + 10) >> 0x20));
  *(undefined1 *)(in_RDI + 0x13) = 1;
  if ((((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 1)) ||
        (*(int *)(in_RDI + 2) <= *(int *)((long)in_RDI + 0xc))) ||
       ((*(int *)((long)in_RDI + 0x14) < 1 || (*(int *)(in_RDI + 3) < 1)))) ||
      (((double)in_RDI[4] <= 0.0 && (double)in_RDI[4] != 0.0 ||
       (((double)in_RDI[5] <= 0.0 ||
        (bVar1 = DistanceCalculation::IsValid((DistanceCalculation *)(in_RDI + 7)), !bVar1)))))) ||
     ((bVar1 = StatisticsAccumulation::IsValid((StatisticsAccumulation *)(in_RDI + 10)), !bVar1 ||
      (bVar1 = VectorQuantization::IsValid((VectorQuantization *)(in_RDI + 0xd)), !bVar1)))) {
    *(undefined1 *)(in_RDI + 0x13) = 0;
  }
  return;
}

Assistant:

LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm(
    int num_order, int initial_codebook_size, int target_codebook_size,
    int min_num_vector_in_cluster, int num_iteration,
    double convergence_threshold, double splitting_factor, int seed)
    : num_order_(num_order),
      initial_codebook_size_(initial_codebook_size),
      target_codebook_size_(target_codebook_size),
      min_num_vector_in_cluster_(min_num_vector_in_cluster),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      splitting_factor_(splitting_factor),
      seed_(seed),
      distance_calculation_(
          num_order_, DistanceCalculation::DistanceMetrics::kSquaredEuclidean),
      statistics_accumulation_(num_order_, 1),
      vector_quantization_(num_order_),
      is_valid_(true) {
  if (num_order_ < 0 || initial_codebook_size_ <= 0 ||
      target_codebook_size_ <= initial_codebook_size_ ||
      min_num_vector_in_cluster_ <= 0 || num_iteration_ <= 0 ||
      convergence_threshold_ < 0.0 || splitting_factor_ <= 0.0 ||
      !distance_calculation_.IsValid() || !statistics_accumulation_.IsValid() ||
      !vector_quantization_.IsValid()) {
    is_valid_ = false;
    return;
  }
}